

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O0

char * Qiniu_MD5_HexStr(char *src)

{
  Qiniu_Digest *self;
  size_t sVar1;
  int local_4c;
  int i;
  Qiniu_Digest *md5_digest;
  char *pcStack_38;
  char temp [3];
  char *signHex;
  byte local_28 [4];
  int signLen;
  uchar sign [16];
  char *src_local;
  
  pcStack_38 = (char *)malloc(0x21);
  self = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);
  sVar1 = strlen(src);
  Qiniu_Digest_Update(self,src,(int)sVar1);
  Qiniu_Digest_Final(self,local_28,(size_t *)0x0);
  Qiniu_Digest_Free(self);
  for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
    snprintf((char *)((long)&md5_digest + 5),3,"%02x",(ulong)local_28[local_4c]);
    md5_digest._7_1_ = 0;
    *(undefined2 *)(pcStack_38 + (local_4c << 1)) = md5_digest._5_2_;
  }
  pcStack_38[0x20] = '\0';
  return pcStack_38;
}

Assistant:

const char *Qiniu_MD5_HexStr(const char *src)
	{
		unsigned char sign[MD5_DIGEST_LENGTH];
		int signLen = MD5_DIGEST_LENGTH * 2 + 1;
		char *signHex = (char *)malloc(sizeof(char) * signLen);
		char temp[3];
		Qiniu_Digest *md5_digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);
		Qiniu_Digest_Update(md5_digest, src, (int)strlen(src));
		Qiniu_Digest_Final(md5_digest, sign, NULL);
		Qiniu_Digest_Free(md5_digest);
		for (int i = 0; i < MD5_DIGEST_LENGTH; i++)
		{
			Qiniu_snprintf(temp, 3, "%02x", sign[i]);
			temp[2] = '\0';
			memcpy(&(signHex[i * 2]), temp, 2);
		}
		signHex[signLen - 1] = '\0';
		return signHex;
	}